

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O1

void pair_lookup_fill_distance(pair_lookup_t pairs,distance_t *distances)

{
  uint uVar1;
  ulong uVar2;
  
  if (1 < (ulong)pairs._16_8_) {
    uVar2 = 1;
    uVar1 = 2;
    do {
      *(uint *)(pairs.outputs_len + uVar2 * 4) =
           CONCAT22(distances[pairs.keys[uVar2] >> (pairs.outputs._4_1_ & 0x1f)],
                    distances[(uint)pairs.outputs & pairs.keys[uVar2]]);
      uVar2 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
    } while (uVar2 < (ulong)pairs._16_8_);
  }
  return;
}

Assistant:

void pair_lookup_fill_distance(pair_lookup_t pairs, distance_t *distances) {
    for (unsigned int i = 1; i < pairs.outputs_len; i += 1) {
        output_pair_t concat_out = pairs.outputs[i];
        unsigned int i_0 = concat_out & pairs.output_mask;
        concat_out >>= pairs.output_width;
        unsigned int i_1 = concat_out;

        pairs.distances[i] = (distances[i_1] << 16) | distances[i_0];
    }
}